

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiosMath.cpp
# Opt level: O0

size_t adios2::helper::GetTotalSize(Dims *dimensions,size_t elementSize)

{
  const_iterator cVar1;
  const_iterator cVar2;
  unsigned_long uVar3;
  undefined8 in_RSI;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_ffffffffffffffc8;
  
  cVar1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                    (in_stack_ffffffffffffffc8);
  cVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end(in_stack_ffffffffffffffc8)
  ;
  uVar3 = std::
          accumulate<__gnu_cxx::__normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,unsigned_long,std::multiplies<unsigned_long>>
                    (cVar1._M_current,cVar2._M_current,in_RSI);
  return uVar3;
}

Assistant:

size_t GetTotalSize(const Dims &dimensions, const size_t elementSize) noexcept
{
    return std::accumulate(dimensions.begin(), dimensions.end(), elementSize,
                           std::multiplies<size_t>());
}